

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageNegate(gdImagePtr src)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  uint uVar5;
  uint uVar6;
  int y;
  int iVar7;
  
  if (src == (gdImagePtr)0x0) {
    return 0;
  }
  if (src->trueColor == 0) {
    pcVar4 = gdImageGetPixel;
  }
  else {
    pcVar4 = gdImageGetTrueColorPixel;
  }
  iVar7 = src->sy;
  if (0 < iVar7) {
    iVar3 = src->sx;
    y = 0;
    do {
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          uVar1 = (*pcVar4)(src,iVar7,y);
          if (src->trueColor == 0) {
            uVar2 = src->red[(int)uVar1];
            uVar5 = src->green[(int)uVar1];
            uVar6 = src->blue[(int)uVar1];
            uVar1 = src->alpha[(int)uVar1];
          }
          else {
            uVar2 = uVar1 >> 0x10 & 0xff;
            uVar5 = uVar1 >> 8 & 0xff;
            uVar6 = uVar1 & 0xff;
            uVar1 = uVar1 >> 0x18 & 0x7f;
          }
          iVar3 = gdImageColorAllocateAlpha(src,0xff - uVar2,0xff - uVar5,0xff - uVar6,uVar1);
          if (iVar3 == -1) {
            iVar3 = gdImageColorClosestAlpha(src,0xff - uVar2,0xff - uVar5,0xff - uVar6,uVar1);
          }
          gdImageSetPixel(src,iVar7,y,iVar3);
          iVar7 = iVar7 + 1;
          iVar3 = src->sx;
        } while (iVar7 < iVar3);
        iVar7 = src->sy;
      }
      y = y + 1;
    } while (y < iVar7);
  }
  return 1;
}

Assistant:

BGD_DECLARE(int) gdImageNegate(gdImagePtr src)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			new_pxl = gdImageColorAllocateAlpha(src, 255-r, 255-g, 255-b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, 255-r, 255-g, 255-b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}